

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O3

REF_STATUS interpolate(REF_MPI ref_mpi,int argc,char **argv)

{
  char *filename;
  char *filename_00;
  REF_GRID_conflict extruded_grid_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  REF_DBL *extruded_field;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  REF_INT ldim;
  REF_GRID_conflict receipt_grid;
  REF_GRID_conflict donor_grid;
  REF_INT pos;
  REF_INTERP ref_interp;
  REF_DBL *receipt_solution;
  REF_GRID_conflict extruded_grid;
  REF_DBL *donor_solution;
  REF_INT persist_ldim;
  uint local_7c;
  REF_GRID_conflict local_78;
  REF_GRID_conflict local_70;
  int local_64;
  REF_INTERP local_60;
  REF_DBL *local_58;
  char *local_50;
  REF_GRID_conflict local_48;
  REF_DBL *local_40;
  uint local_34;
  
  local_70 = (REF_GRID)0x0;
  local_78 = (REF_GRID)0x0;
  if (argc < 6) {
    if (ref_mpi->id == 0) {
      interpolate_help(*argv);
      return 1;
    }
    return 1;
  }
  pcVar5 = argv[2];
  filename = argv[3];
  filename_00 = argv[4];
  local_50 = argv[5];
  ref_mpi_stopwatch_start(ref_mpi);
  if (ref_mpi->n < 2) {
    if (ref_mpi->id == 0) {
      printf("import %s\n",pcVar5);
    }
    uVar1 = ref_import_by_extension(&local_70,ref_mpi,pcVar5);
    if (uVar1 != 0) {
      pcVar5 = "import";
      uVar4 = 0x8c3;
      goto LAB_00114b97;
    }
    pcVar5 = "donor import";
  }
  else {
    if (ref_mpi->id == 0) {
      printf("part %s\n",pcVar5);
    }
    uVar1 = ref_part_by_extension(&local_70,ref_mpi,pcVar5);
    if (uVar1 != 0) {
      pcVar5 = "part";
      uVar4 = 0x8bf;
      goto LAB_00114b97;
    }
    pcVar5 = "donor part";
  }
  ref_mpi_stopwatch_stop(ref_mpi,pcVar5);
  if ((ref_mpi->id == 0) &&
     (printf("  read %ld vertices\n",local_70->node->old_n_global), ref_mpi->id == 0)) {
    printf("part solution %s\n",filename);
  }
  uVar1 = ref_part_scalar(local_70,(REF_INT *)&local_7c,&local_40,filename);
  if (uVar1 != 0) {
    pcVar5 = "part solution";
    uVar4 = 0x8cc;
    goto LAB_00114b97;
  }
  ref_mpi_stopwatch_stop(ref_mpi,"donor part solution");
  if (ref_mpi->n < 2) {
    if (ref_mpi->id == 0) {
      printf("import %s\n",filename_00);
    }
    uVar1 = ref_import_by_extension(&local_78,ref_mpi,filename_00);
    if (uVar1 != 0) {
      pcVar5 = "import";
      uVar4 = 0x8d6;
      goto LAB_00114b97;
    }
    pcVar5 = "receptor import";
  }
  else {
    if (ref_mpi->id == 0) {
      printf("part %s\n",filename_00);
    }
    uVar1 = ref_part_by_extension(&local_78,ref_mpi,filename_00);
    if (uVar1 != 0) {
      pcVar5 = "part";
      uVar4 = 0x8d1;
      goto LAB_00114b97;
    }
    pcVar5 = "receptor part";
  }
  ref_mpi_stopwatch_stop(ref_mpi,pcVar5);
  if ((ref_mpi->id == 0) &&
     (printf("  read %ld vertices\n",local_78->node->old_n_global), ref_mpi->id == 0)) {
    printf("%d leading dim from %ld donor nodes to %ld receptor nodes\n",(ulong)local_7c,
           local_70->node->old_n_global,local_78->node->old_n_global);
  }
  uVar2 = ref_args_find(argc,argv,"--face",&local_64);
  uVar1 = 0;
  if ((uVar2 != 0) && (uVar2 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x8e4,"interpolate",(ulong)uVar2,"arg search");
    uVar1 = uVar2;
  }
  if ((uVar2 != 5) && (uVar2 != 0)) {
    return uVar1;
  }
  if (local_64 < argc + -2 && local_64 != -1) {
    lVar6 = (long)local_64;
    uVar2 = atoi(argv[lVar6 + 1]);
    pcVar5 = argv[lVar6 + 2];
    if (ref_mpi->id == 0) {
      printf("part persist solution %s\n",pcVar5);
    }
    uVar3 = ref_part_scalar(local_78,(REF_INT *)&local_34,&local_58,pcVar5);
    if (uVar3 != 0) {
      pcVar5 = "part solution";
      uVar4 = 0x8ec;
LAB_00114dc4:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             uVar4,"interpolate",(ulong)uVar3,pcVar5);
      return uVar3;
    }
    ref_mpi_stopwatch_stop(ref_mpi,"persist part solution");
    if (local_7c != local_34) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x8ee,"interpolate","persist leading dimension different than donor",
             (long)(int)local_7c,(long)(int)local_34);
      return 1;
    }
    if (ref_mpi->id == 0) {
      printf("update solution on faceid %d\n",(ulong)uVar2);
    }
    uVar3 = ref_interp_create(&local_60,local_70,local_78);
    if (uVar3 != 0) {
      pcVar5 = "make interp";
      uVar4 = 0x8f2;
      goto LAB_00114dc4;
    }
    uVar2 = ref_interp_face_only(local_60,uVar2,local_7c,local_40,local_58);
    if (uVar2 != 0) {
      pcVar5 = "map";
      uVar4 = 0x8f5;
      goto LAB_00114edd;
    }
    pcVar5 = "update";
  }
  else {
    if (ref_mpi->id == 0) {
      puts("locate receptor nodes");
    }
    uVar2 = ref_interp_create(&local_60,local_70,local_78);
    if (uVar2 != 0) {
      pcVar5 = "make interp";
      uVar4 = 0x8fa;
LAB_00114edd:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             uVar4,"interpolate",(ulong)uVar2,pcVar5);
      return uVar2;
    }
    uVar2 = ref_interp_locate(local_60);
    if (uVar2 != 0) {
      pcVar5 = "map";
      uVar4 = 0x8fb;
      goto LAB_00114edd;
    }
    ref_mpi_stopwatch_stop(ref_mpi,"locate");
    if (ref_mpi->id == 0) {
      puts("interpolate receptor nodes");
    }
    uVar2 = local_7c;
    uVar3 = local_78->node->max * local_7c;
    if ((int)uVar3 < 0) {
      pcVar5 = "malloc receipt_solution of REF_DBL negative";
      uVar4 = 0x8ff;
      goto LAB_0011502a;
    }
    local_58 = (REF_DBL *)malloc((ulong)uVar3 << 3);
    if (local_58 == (REF_DBL *)0x0) {
      pcVar5 = "malloc receipt_solution of REF_DBL NULL";
      uVar4 = 0x8ff;
      goto LAB_0011505c;
    }
    uVar2 = ref_interp_scalar(local_60,uVar2,local_40,local_58);
    if (uVar2 != 0) {
      pcVar5 = "interp scalar";
      uVar4 = 0x901;
      goto LAB_00114edd;
    }
    pcVar5 = "interp";
  }
  ref_mpi_stopwatch_stop(ref_mpi,pcVar5);
  uVar2 = ref_args_find(argc,argv,"--extrude",&local_64);
  if ((uVar2 != 0) && (uVar2 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x906,"interpolate",(ulong)uVar2,"arg search");
    uVar1 = uVar2;
  }
  pcVar5 = local_50;
  if ((uVar2 != 5) && (uVar2 != 0)) {
    return uVar1;
  }
  if (local_64 == -1) {
    if (ref_mpi->id == 0) {
      printf("writing receptor solution %s\n",local_50);
    }
    uVar1 = ref_gather_scalar_by_extension(local_78,local_7c,local_58,(char **)0x0,pcVar5);
    if (uVar1 != 0) {
      pcVar5 = "gather recept";
      uVar4 = 0x91d;
      goto LAB_00114b97;
    }
    ref_mpi_stopwatch_stop(ref_mpi,"gather receptor");
  }
  else {
    if (ref_mpi->id == 0) {
      puts("extrude receptor solution");
    }
    uVar1 = ref_grid_extrude_twod(&local_48,local_78,2);
    extruded_grid_00 = local_48;
    uVar2 = local_7c;
    if (uVar1 != 0) {
      pcVar5 = "extrude";
      uVar4 = 0x90b;
      goto LAB_00114b97;
    }
    uVar1 = local_48->node->max * local_7c;
    if ((int)uVar1 < 0) {
      pcVar5 = "malloc extruded_solution of REF_DBL negative";
      uVar4 = 0x90d;
LAB_0011502a:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             uVar4,"interpolate",pcVar5);
      return 1;
    }
    extruded_field = (REF_DBL *)malloc((ulong)uVar1 << 3);
    if (extruded_field == (REF_DBL *)0x0) {
      pcVar5 = "malloc extruded_solution of REF_DBL NULL";
      uVar4 = 0x90d;
LAB_0011505c:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             uVar4,"interpolate",pcVar5);
      return 2;
    }
    uVar1 = ref_grid_extrude_field(local_78,uVar2,local_58,extruded_grid_00,extruded_field);
    if (uVar1 != 0) {
      pcVar5 = "extrude solution";
      uVar4 = 0x910;
      goto LAB_00114b97;
    }
    if (ref_mpi->id == 0) {
      printf("writing interpolated extruded solution %s\n",local_50);
    }
    uVar1 = ref_gather_scalar_by_extension(local_48,local_7c,extruded_field,(char **)0x0,local_50);
    if (uVar1 != 0) {
      pcVar5 = "gather recept";
      uVar4 = 0x915;
      goto LAB_00114b97;
    }
    free(extruded_field);
    uVar1 = ref_grid_free(local_48);
    if (uVar1 != 0) {
      pcVar5 = "free";
      uVar4 = 0x917;
      goto LAB_00114b97;
    }
  }
  if (local_58 != (REF_DBL *)0x0) {
    free(local_58);
  }
  ref_interp_free(local_60);
  uVar1 = ref_grid_free(local_78);
  if (uVar1 == 0) {
    if (local_40 != (REF_DBL *)0x0) {
      free(local_40);
    }
    uVar1 = ref_grid_free(local_70);
    if (uVar1 == 0) {
      return 0;
    }
    pcVar5 = "donor";
    uVar4 = 0x925;
  }
  else {
    pcVar5 = "receipt";
    uVar4 = 0x923;
  }
LAB_00114b97:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
         uVar4,"interpolate",(ulong)uVar1,pcVar5);
  return uVar1;
}

Assistant:

static REF_STATUS interpolate(REF_MPI ref_mpi, int argc, char *argv[]) {
  char *receipt_solb;
  char *receipt_meshb;
  char *donor_solb;
  char *donor_meshb;
  char *persist_solb;
  REF_GRID donor_grid = NULL;
  REF_GRID receipt_grid = NULL;
  REF_INT ldim, persist_ldim;
  REF_DBL *donor_solution, *receipt_solution;
  REF_INTERP ref_interp;
  REF_INT pos;
  REF_INT faceid;

  if (argc < 6) goto shutdown;
  donor_meshb = argv[2];
  donor_solb = argv[3];
  receipt_meshb = argv[4];
  receipt_solb = argv[5];

  ref_mpi_stopwatch_start(ref_mpi);

  if (ref_mpi_para(ref_mpi)) {
    if (ref_mpi_once(ref_mpi)) printf("part %s\n", donor_meshb);
    RSS(ref_part_by_extension(&donor_grid, ref_mpi, donor_meshb), "part");
    ref_mpi_stopwatch_stop(ref_mpi, "donor part");
  } else {
    if (ref_mpi_once(ref_mpi)) printf("import %s\n", donor_meshb);
    RSS(ref_import_by_extension(&donor_grid, ref_mpi, donor_meshb), "import");
    ref_mpi_stopwatch_stop(ref_mpi, "donor import");
  }
  if (ref_mpi_once(ref_mpi))
    printf("  read " REF_GLOB_FMT " vertices\n",
           ref_node_n_global(ref_grid_node(donor_grid)));

  if (ref_mpi_once(ref_mpi)) printf("part solution %s\n", donor_solb);
  RSS(ref_part_scalar(donor_grid, &ldim, &donor_solution, donor_solb),
      "part solution");
  ref_mpi_stopwatch_stop(ref_mpi, "donor part solution");

  if (ref_mpi_para(ref_mpi)) {
    if (ref_mpi_once(ref_mpi)) printf("part %s\n", receipt_meshb);
    RSS(ref_part_by_extension(&receipt_grid, ref_mpi, receipt_meshb), "part");
    ref_mpi_stopwatch_stop(ref_mpi, "receptor part");
  } else {
    if (ref_mpi_once(ref_mpi)) printf("import %s\n", receipt_meshb);
    RSS(ref_import_by_extension(&receipt_grid, ref_mpi, receipt_meshb),
        "import");
    ref_mpi_stopwatch_stop(ref_mpi, "receptor import");
  }
  if (ref_mpi_once(ref_mpi))
    printf("  read " REF_GLOB_FMT " vertices\n",
           ref_node_n_global(ref_grid_node(receipt_grid)));

  if (ref_mpi_once(ref_mpi)) {
    printf("%d leading dim from " REF_GLOB_FMT " donor nodes to " REF_GLOB_FMT
           " receptor nodes\n",
           ldim, ref_node_n_global(ref_grid_node(donor_grid)),
           ref_node_n_global(ref_grid_node(receipt_grid)));
  }

  RXS(ref_args_find(argc, argv, "--face", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos && pos < argc - 2) {
    faceid = atoi(argv[pos + 1]);
    persist_solb = argv[pos + 2];
    if (ref_mpi_once(ref_mpi))
      printf("part persist solution %s\n", persist_solb);
    RSS(ref_part_scalar(receipt_grid, &persist_ldim, &receipt_solution,
                        persist_solb),
        "part solution");
    ref_mpi_stopwatch_stop(ref_mpi, "persist part solution");
    REIS(ldim, persist_ldim, "persist leading dimension different than donor");

    if (ref_mpi_once(ref_mpi)) printf("update solution on faceid %d\n", faceid);
    RSS(ref_interp_create(&ref_interp, donor_grid, receipt_grid),
        "make interp");
    RSS(ref_interp_face_only(ref_interp, faceid, ldim, donor_solution,
                             receipt_solution),
        "map");
    ref_mpi_stopwatch_stop(ref_mpi, "update");
  } else {
    if (ref_mpi_once(ref_mpi)) printf("locate receptor nodes\n");
    RSS(ref_interp_create(&ref_interp, donor_grid, receipt_grid),
        "make interp");
    RSS(ref_interp_locate(ref_interp), "map");
    ref_mpi_stopwatch_stop(ref_mpi, "locate");
    if (ref_mpi_once(ref_mpi)) printf("interpolate receptor nodes\n");
    ref_malloc(receipt_solution,
               ldim * ref_node_max(ref_grid_node(receipt_grid)), REF_DBL);
    RSS(ref_interp_scalar(ref_interp, ldim, donor_solution, receipt_solution),
        "interp scalar");
    ref_mpi_stopwatch_stop(ref_mpi, "interp");
  }

  RXS(ref_args_find(argc, argv, "--extrude", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    REF_GRID extruded_grid;
    REF_DBL *extruded_solution = NULL;
    if (ref_mpi_once(ref_mpi)) printf("extrude receptor solution\n");
    RSS(ref_grid_extrude_twod(&extruded_grid, receipt_grid, 2), "extrude");
    ref_malloc(extruded_solution,
               ldim * ref_node_max(ref_grid_node(extruded_grid)), REF_DBL);
    RSS(ref_grid_extrude_field(receipt_grid, ldim, receipt_solution,
                               extruded_grid, extruded_solution),
        "extrude solution");
    if (ref_mpi_once(ref_mpi))
      printf("writing interpolated extruded solution %s\n", receipt_solb);
    RSS(ref_gather_scalar_by_extension(extruded_grid, ldim, extruded_solution,
                                       NULL, receipt_solb),
        "gather recept");
    ref_free(extruded_solution);
    RSS(ref_grid_free(extruded_grid), "free");
  } else {
    if (ref_mpi_once(ref_mpi))
      printf("writing receptor solution %s\n", receipt_solb);
    RSS(ref_gather_scalar_by_extension(receipt_grid, ldim, receipt_solution,
                                       NULL, receipt_solb),
        "gather recept");
    ref_mpi_stopwatch_stop(ref_mpi, "gather receptor");
  }

  ref_free(receipt_solution);
  ref_interp_free(ref_interp);
  RSS(ref_grid_free(receipt_grid), "receipt");
  ref_free(donor_solution);
  RSS(ref_grid_free(donor_grid), "donor");

  return REF_SUCCESS;
shutdown:
  if (ref_mpi_once(ref_mpi)) interpolate_help(argv[0]);
  return REF_FAILURE;
}